

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cc
# Opt level: O0

Info * __thiscall wabt::Opcode::GetInfo(Info *__return_storage_ptr__,Opcode *this)

{
  uint32_t uVar1;
  Opcode *this_local;
  
  if (this->enum_ < Invalid) {
    memcpy(__return_storage_ptr__,infos_ + (ulong)this->enum_ * 0x48,0x48);
  }
  else {
    memcpy(__return_storage_ptr__,infos_ + 0x9948,0x48);
    DecodeInvalidOpcode(this->enum_,&__return_storage_ptr__->prefix,&__return_storage_ptr__->code);
    uVar1 = PrefixCode(__return_storage_ptr__->prefix,__return_storage_ptr__->code);
    __return_storage_ptr__->prefix_code = uVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

Opcode::Info Opcode::GetInfo() const {
  if (enum_ < Invalid) {
    return infos_[enum_];
  }

  Info invalid_info = infos_[Opcode::Invalid];
  DecodeInvalidOpcode(enum_, &invalid_info.prefix, &invalid_info.code);
  invalid_info.prefix_code = PrefixCode(invalid_info.prefix, invalid_info.code);
  return invalid_info;
}